

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierParser::addWord(CQualifierParser *this)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  char *pcVar5;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  ulong local_18;
  size_type i;
  CQualifierParser *this_local;
  
  i = (size_type)this;
  for (local_18 = 0; uVar2 = local_18, uVar3 = std::__cxx11::string::length(), uVar2 < uVar3;
      local_18 = local_18 + 1) {
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&(this->token).word);
    switch(*puVar4) {
    case 0x42:
    case 0x62:
      CQualifierBuilder::AddB(&this->builder);
      break;
    default:
      (this->token).position = (this->token).position + (int)local_18;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&(this->token).word);
      cVar1 = *pcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,1,cVar1,&local_79);
      std::operator+((char *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "primary qualifier `");
      std::operator+(local_38,(char *)local_58);
      error(this,local_38);
      std::__cxx11::string::~string((string *)local_38);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      return;
    case 0x44:
    case 100:
      CQualifierBuilder::AddD(&this->builder);
      break;
    case 0x46:
    case 0x66:
      CQualifierBuilder::AddF(&this->builder);
      break;
    case 0x4c:
    case 0x6c:
      CQualifierBuilder::AddL(&this->builder);
      break;
    case 0x4e:
    case 0x6e:
      CQualifierBuilder::AddN(&this->builder);
      break;
    case 0x4f:
    case 0x6f:
      CQualifierBuilder::AddO(&this->builder);
      break;
    case 0x53:
    case 0x73:
      CQualifierBuilder::AddS(&this->builder);
      break;
    case 0x57:
    case 0x77:
      CQualifierBuilder::AddW(&this->builder);
    }
  }
  this->afterRightParen = false;
  return;
}

Assistant:

void CQualifierParser::addWord()
{
	for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
		switch( token.word[i] ) {
			case 's': case 'S':
				builder.AddS();
				break;
			case 'f': case 'F':
				builder.AddF();
				break;
			case 'n': case 'N':
				builder.AddN();
				break;
			case 'o': case 'O':
				builder.AddO();
				break;
			case 'l': case 'L':
				builder.AddL();
				break;
			case 'd': case 'D':
				builder.AddD();
				break;
			case 'w': case 'W':
				builder.AddW();
				break;
			case 'b': case 'B':
				builder.AddB();
				break;
			default:
				token.position += i;
				error( "primary qualifier `" +
					std::string( 1, token.word[i] ) + "` does not exist" );
				return;
		}
	}
	afterRightParen = false;
}